

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  int iVar1;
  int local_11c;
  int ret;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_ge p;
  secp256k1_gej pj;
  uchar *seckey_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubkey,0,0x40);
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else if (seckey == (uchar *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_scalar_set_b32((secp256k1_scalar *)&ret,seckey,&local_11c);
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&ret);
      ctx_local._4_4_ = (uint)((local_11c != 0 ^ 0xffU) & 1 & (iVar1 != 0 ^ 0xffU) & 1);
      if (ctx_local._4_4_ != 0) {
        secp256k1_ecmult_gen
                  (&ctx->ecmult_gen_ctx,(secp256k1_gej *)(p.y.n + 9),(secp256k1_scalar *)&ret);
        secp256k1_ge_set_gej((secp256k1_ge *)(sec.d + 6),(secp256k1_gej *)(p.y.n + 9));
        secp256k1_pubkey_save(pubkey,(secp256k1_ge *)(sec.d + 6));
      }
      secp256k1_scalar_clear((secp256k1_scalar *)&ret);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_gej pj;
    secp256k1_ge p;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = (!overflow) & (!secp256k1_scalar_is_zero(&sec));
    if (ret) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pj, &sec);
        secp256k1_ge_set_gej(&p, &pj);
        secp256k1_pubkey_save(pubkey, &p);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}